

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImDrawDataBuilder::Clear(ImDrawDataBuilder *this)

{
  int iVar1;
  void *pvVar2;
  void *__dest;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  lVar3 = 0;
  do {
    iVar1 = *(int *)((long)&this->Layers[0].Capacity + lVar3);
    if (iVar1 < 0) {
      uVar4 = iVar1 / 2 + iVar1;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = 0;
      }
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (*GImAllocatorAllocFunc)(uVar5 * 8,GImAllocatorUserData);
      pvVar2 = *(void **)((long)&this->Layers[0].Data + lVar3);
      if (pvVar2 != (void *)0x0) {
        memcpy(__dest,pvVar2,(long)*(int *)((long)&this->Layers[0].Size + lVar3) << 3);
        pvVar2 = *(void **)((long)&this->Layers[0].Data + lVar3);
        if (pvVar2 != (void *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pvVar2,GImAllocatorUserData);
      }
      *(void **)((long)&this->Layers[0].Data + lVar3) = __dest;
      *(int *)((long)&this->Layers[0].Capacity + lVar3) = (int)uVar5;
    }
    *(undefined4 *)((long)&this->Layers[0].Size + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 == 0x10);
  return;
}

Assistant:

void Clear()            { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].resize(0); }